

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImTriangulator::GetNextTriangle(ImTriangulator *this,uint *out_triangle)

{
  ImTriangulatorNode *pIVar1;
  ImTriangulatorNode *n1;
  ImTriangulatorNode *pIVar2;
  ImTriangulatorNode **ppIVar3;
  int iVar4;
  
  iVar4 = (this->_Ears).Size;
  if (iVar4 == 0) {
    FlipNodeList(this);
    ppIVar3 = &this->_Nodes;
    for (iVar4 = this->_TrianglesLeft; -1 < iVar4; iVar4 = iVar4 + -1) {
      pIVar1 = *ppIVar3;
      pIVar1->Type = ImTriangulatorNodeType_Convex;
      ppIVar3 = &pIVar1->Next;
    }
    (this->_Reflexes).Size = 0;
    BuildReflexes(this);
    BuildEars(this);
    iVar4 = (this->_Ears).Size;
    if (iVar4 == 0) {
      *(this->_Ears).Data = this->_Nodes;
      iVar4 = 1;
    }
  }
  (this->_Ears).Size = iVar4 + -1;
  pIVar1 = (this->_Ears).Data[(long)iVar4 + -1];
  n1 = pIVar1->Prev;
  *out_triangle = n1->Index;
  out_triangle[1] = pIVar1->Index;
  pIVar2 = pIVar1->Next;
  out_triangle[2] = pIVar2->Index;
  pIVar2->Prev = n1;
  n1->Next = pIVar2;
  if (pIVar1 == this->_Nodes) {
    this->_Nodes = pIVar2;
  }
  ReclassifyNode(this,n1);
  ReclassifyNode(this,pIVar1->Next);
  this->_TrianglesLeft = this->_TrianglesLeft + -1;
  return;
}

Assistant:

void ImTriangulator::GetNextTriangle(unsigned int out_triangle[3])
{
    if (_Ears.Size == 0)
    {
        FlipNodeList();

        ImTriangulatorNode* node = _Nodes;
        for (int i = _TrianglesLeft; i >= 0; i--, node = node->Next)
            node->Type = ImTriangulatorNodeType_Convex;
        _Reflexes.Size = 0;
        BuildReflexes();
        BuildEars();

        // If we still don't have ears, it means geometry is degenerated.
        if (_Ears.Size == 0)
        {
            // Return first triangle available, mimicking the behavior of convex fill.
            IM_ASSERT(_TrianglesLeft > 0); // Geometry is degenerated
            _Ears.Data[0] = _Nodes;
            _Ears.Size    = 1;
        }
    }

    ImTriangulatorNode* ear = _Ears.Data[--_Ears.Size];
    out_triangle[0] = ear->Prev->Index;
    out_triangle[1] = ear->Index;
    out_triangle[2] = ear->Next->Index;

    ear->Unlink();
    if (ear == _Nodes)
        _Nodes = ear->Next;

    ReclassifyNode(ear->Prev);
    ReclassifyNode(ear->Next);
    _TrianglesLeft--;
}